

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

StateSet *
Omega_h::step(StateSet *__return_storage_ptr__,StateSet *ss,int symbol,FiniteAutomaton *fa)

{
  bool bVar1;
  reference piVar2;
  int local_50;
  int local_4c;
  int next_state;
  int state;
  iterator __end1;
  iterator __begin1;
  StateSet *__range1;
  FiniteAutomaton *fa_local;
  int symbol_local;
  StateSet *ss_local;
  StateSet *next_ss;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__);
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(ss);
  _next_state = std::set<int,_std::less<int>,_std::allocator<int>_>::end(ss);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&next_state), bVar1) {
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    local_4c = *piVar2;
    local_50 = step(fa,local_4c,symbol);
    if (local_50 != -1) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert(__return_storage_ptr__,&local_50);
    }
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static StateSet step(
    StateSet const& ss, int symbol, FiniteAutomaton const& fa) {
  StateSet next_ss;
  for (auto state : ss) {
    auto next_state = step(fa, state, symbol);
    if (next_state != -1) next_ss.insert(next_state);
  }
  return next_ss;
}